

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_qemu_st32fs(DisasContext_conflict10 *ctx,TCGv_i64 src,TCGv_i64 addr)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i32 val;
  uintptr_t o;
  TCGTemp *local_30;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  val = tcg_temp_new_i32(tcg_ctx);
  local_30 = (TCGTemp *)(src + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,helper_tosingle,(TCGTemp *)(val + (long)&tcg_ctx->pool_cur),1,
                      &local_30);
  tcg_gen_qemu_st_i32_ppc64(tcg_ctx,val,addr,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_32)
  ;
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val + (long)&tcg_ctx->pool_cur));
  return;
}

Assistant:

static void gen_qemu_st32fs(DisasContext *ctx, TCGv_i64 src, TCGv addr)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    gen_helper_tosingle(tcg_ctx, tmp, src);
    tcg_gen_qemu_st_i32(tcg_ctx, tmp, addr, ctx->mem_idx, DEF_MEMOP(MO_UL));
    tcg_temp_free_i32(tcg_ctx, tmp);
}